

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressSuperBlock(ZSTD_CCtx *zc,void *dst,size_t dstCapacity,uint lastBlock)

{
  FSE_repeat *pFVar1;
  FSE_CTable *prevCTable;
  seqDef *psVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  U32 *pUVar4;
  byte bVar5;
  symbolEncodingType_e sVar6;
  int iVar7;
  size_t err_code_5;
  BYTE *pBVar8;
  size_t sVar9;
  size_t sVar10;
  byte *pbVar11;
  uint uVar12;
  size_t err_code_4;
  uint *puVar13;
  BYTE *sourceSize;
  size_t sVar14;
  seqDef *psVar15;
  uint uVar16;
  uint *dstCapacity_00;
  uint uVar17;
  ulong uVar18;
  byte *pbVar19;
  ulong sourceSize_00;
  ulong uVar20;
  size_t err_code;
  byte *pbVar21;
  byte *pbVar22;
  long lVar23;
  bool bVar24;
  ulong wkspSize;
  uint max;
  ZSTD_compressedBlockState_t *local_508;
  byte local_4fc;
  byte local_4fb;
  byte local_4fa;
  byte local_4f9;
  seqDef *local_4f8;
  uint *local_4f0;
  ZSTD_fseCTables_t *local_4e8;
  byte *local_4e0;
  BYTE *local_4d8;
  U32 *local_4d0;
  byte *local_4c8;
  uint *local_4c0;
  BYTE *local_4b8;
  ZSTD_fseCTables_t *local_4b0;
  byte *local_4a8;
  byte *local_4a0;
  size_t local_498;
  ZSTD_compressedBlockState_t *local_490;
  uint local_484;
  byte *local_480;
  byte *local_478;
  ZSTD_CCtx *local_470;
  FSE_CTable *local_468;
  FSE_CTable *local_460;
  ulong local_458;
  seqDef *local_450;
  byte *local_448;
  int local_440;
  undefined1 local_43c [500];
  size_t local_248;
  symbolEncodingType_e local_240;
  symbolEncodingType_e local_23c;
  symbolEncodingType_e local_238;
  byte local_234 [500];
  byte *local_40;
  size_t local_38;
  
  local_508 = (zc->blockState).prevCBlock;
  pZVar3 = (zc->blockState).nextCBlock;
  puVar13 = zc->entropyWorkspace;
  pBVar8 = (zc->seqStore).litStart;
  sourceSize = (zc->seqStore).lit + -(long)pBVar8;
  max = 0xff;
  local_4a8 = (byte *)dstCapacity;
  local_484 = lastBlock;
  memcpy(pZVar3,local_508,0x404);
  iVar7 = 0;
  local_4f0 = puVar13;
  if ((BYTE *)0x3f < sourceSize) {
    pBVar8 = (BYTE *)HIST_count_wksp(puVar13,&max,pBVar8,(size_t)sourceSize,puVar13,0x1800);
    puVar13 = local_4f0;
    if ((BYTE *)0xffffffffffffff88 < pBVar8) {
      return (size_t)pBVar8;
    }
    if (pBVar8 == sourceSize) {
      iVar7 = 1;
    }
    else if ((BYTE *)(((ulong)sourceSize >> 7) + 4) < pBVar8) {
      local_4f8 = (seqDef *)(local_4f0 + 0x100);
      iVar7 = 0;
      memset(pZVar3,0,0x400);
      local_4d0 = (U32 *)CONCAT44(local_4d0._4_4_,max);
      uVar16 = HUF_optimalTableLog(0xb,(size_t)sourceSize,max);
      uVar12 = (uint)local_4d0;
      sVar9 = HUF_buildCTable_wksp
                        ((HUF_CElt *)pZVar3,puVar13,(uint)local_4d0,uVar16,local_4f8,0x1400);
      if (0xffffffffffffff88 < sVar9) {
        return sVar9;
      }
      sVar14 = HUF_estimateCompressedSize((HUF_CElt *)pZVar3,local_4f0,uVar12);
      local_4a0 = (byte *)dst;
      local_248 = HUF_writeCTable(local_43c,500,(HUF_CElt *)pZVar3,uVar12,(uint)sVar9);
      dst = local_4a0;
      if ((BYTE *)(local_248 + sVar14) < sourceSize) {
        local_440 = 2;
        if (0xffffffffffffff88 < local_248) {
          return local_248;
        }
        goto LAB_0010df4e;
      }
    }
  }
  local_248 = 0;
  local_4a0 = (byte *)dst;
  local_440 = iVar7;
LAB_0010df4e:
  puVar13 = local_4f0;
  local_4f8 = (seqDef *)(ulong)(zc->appliedParams).cParams.strategy;
  local_4b8 = (zc->seqStore).ofCode;
  pBVar8 = (zc->seqStore).llCode;
  local_4b0 = (ZSTD_fseCTables_t *)(zc->seqStore).mlCode;
  sVar14 = (long)(zc->seqStore).sequences - (long)(zc->seqStore).sequencesStart >> 3;
  local_470 = zc;
  memset(local_4f0,0,0x1800);
  local_38 = 0;
  ZSTD_seqToCodes(&zc->seqStore);
  max = 0x23;
  local_4e8 = (ZSTD_fseCTables_t *)pBVar8;
  sVar9 = HIST_countFast_wksp(puVar13,&max,pBVar8,sVar14,puVar13,0x1800);
  uVar12 = max;
  pFVar1 = &(pZVar3->entropy).fse.litlength_repeatMode;
  (pZVar3->entropy).fse.litlength_repeatMode = (local_508->entropy).fse.litlength_repeatMode;
  prevCTable = (local_508->entropy).fse.litlengthCTable;
  local_4d0 = (U32 *)sVar14;
  sVar6 = ZSTD_selectEncodingType
                    (pFVar1,puVar13,max,sVar9,sVar14,9,prevCTable,LL_defaultNorm,6,
                     ZSTD_defaultAllowed,(ZSTD_strategy)local_4f8);
  pUVar4 = local_4d0;
  if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
    __assert_fail("!(LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x260a,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  local_4c0 = local_4f0 + 0x35;
  sVar9 = ZSTD_buildCTable(local_234,500,(pZVar3->entropy).fse.litlengthCTable,9,sVar6,local_4f0,
                           uVar12,(BYTE *)local_4e8,(size_t)local_4d0,LL_defaultNorm,6,0x23,
                           prevCTable,0x524,local_4c0,0x172c);
  puVar13 = local_4f0;
  if (sVar9 < 0xffffffffffffff89) {
    local_4e8 = &(local_508->entropy).fse;
    if (sVar6 == set_compressed) {
      local_38 = sVar9;
    }
    max = 0x1f;
    local_240 = sVar6;
    sVar14 = HIST_countFast_wksp(local_4f0,&max,local_4b8,(size_t)pUVar4,local_4f0,0x1800);
    uVar12 = max;
    pFVar1 = &(pZVar3->entropy).fse.offcode_repeatMode;
    (pZVar3->entropy).fse.offcode_repeatMode = (local_508->entropy).fse.offcode_repeatMode;
    sVar6 = ZSTD_selectEncodingType
                      (pFVar1,puVar13,max,sVar14,(size_t)pUVar4,8,local_4e8->offcodeCTable,
                       OF_defaultNorm,5,(uint)(max < 0x1d),(ZSTD_strategy)local_4f8);
    if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
      __assert_fail("!(Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2622,
                    "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                   );
    }
    pbVar21 = local_234 + sVar9;
    sVar9 = ZSTD_buildCTable(pbVar21,(long)&local_40 - (long)pbVar21,
                             (pZVar3->entropy).fse.offcodeCTable,8,sVar6,local_4f0,uVar12,local_4b8,
                             (size_t)pUVar4,OF_defaultNorm,5,0x1c,local_4e8->offcodeCTable,0x304,
                             local_4c0,0x172c);
    puVar13 = local_4f0;
    if (sVar9 < 0xffffffffffffff89) {
      if (sVar6 == set_compressed) {
        local_38 = sVar9;
      }
      max = 0x34;
      local_23c = sVar6;
      sVar14 = HIST_countFast_wksp(local_4f0,&max,local_4b0,(size_t)pUVar4,local_4f0,0x1800);
      uVar12 = max;
      pFVar1 = &(pZVar3->entropy).fse.matchlength_repeatMode;
      (pZVar3->entropy).fse.matchlength_repeatMode = (local_508->entropy).fse.matchlength_repeatMode
      ;
      local_508 = (ZSTD_compressedBlockState_t *)(local_508->entropy).fse.matchlengthCTable;
      sVar6 = ZSTD_selectEncodingType
                        (pFVar1,puVar13,max,sVar14,(size_t)pUVar4,9,(FSE_CTable *)local_508,
                         ML_defaultNorm,6,ZSTD_defaultAllowed,(ZSTD_strategy)local_4f8);
      if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
        __assert_fail("!(MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2638,
                      "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                     );
      }
      pbVar21 = pbVar21 + sVar9;
      sVar9 = ZSTD_buildCTable(pbVar21,(long)&local_40 - (long)pbVar21,
                               (pZVar3->entropy).fse.matchlengthCTable,9,sVar6,local_4f0,uVar12,
                               (BYTE *)local_4b0,(size_t)pUVar4,ML_defaultNorm,6,0x34,
                               (FSE_CTable *)local_508,0x5ac,local_4c0,0x172c);
      pbVar19 = local_4a0;
      if (sVar9 < 0xffffffffffffff89) {
        if (sVar6 == set_compressed) {
          local_38 = sVar9;
        }
        local_40 = pbVar21 + (sVar9 - (long)local_234);
        local_238 = sVar6;
        if ((byte *)0x1f4 < local_40) {
          __assert_fail("(size_t) (op-ostart) <= sizeof(fseMetadata->fseTablesBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2643,
                        "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                       );
        }
        local_508 = (ZSTD_compressedBlockState_t *)CONCAT44(local_508._4_4_,1);
        pZVar3 = (local_470->blockState).nextCBlock;
        local_458 = (ulong)(uint)local_470->bmi2;
        local_4d0 = local_470->entropyWorkspace;
        local_4f8 = (local_470->seqStore).sequencesStart;
        psVar15 = (local_470->seqStore).sequences;
        local_4d8 = (local_470->seqStore).litStart;
        local_4a8 = local_4a0 + (long)local_4a8;
        local_4e8 = (ZSTD_fseCTables_t *)(local_470->seqStore).llCode;
        local_4b8 = (local_470->seqStore).mlCode;
        local_4c0 = (uint *)(local_470->seqStore).ofCode;
        local_448 = (byte *)(local_470->appliedParams).targetCBlockSize;
        wkspSize = 0x10e3f1;
        local_480 = (byte *)ZSTD_seqDecompressedSize
                                      (local_4f8,(long)psVar15 - (long)local_4f8 >> 3,
                                       (long)(local_470->seqStore).lit - (long)local_4d8);
        local_4b0 = &(pZVar3->entropy).fse;
        local_460 = (pZVar3->entropy).fse.litlengthCTable;
        local_468 = (pZVar3->entropy).fse.matchlengthCTable;
        local_4e0 = pbVar19;
        puVar13 = (uint *)0x0;
        uVar20 = 0;
        local_490 = pZVar3;
        local_450 = psVar15;
LAB_0010e43c:
        do {
          do {
            psVar2 = local_4f8 + (long)puVar13;
            if (psVar15 <= psVar2) {
              if (local_480 != (byte *)0x0) {
                return 0;
              }
              return (size_t)(local_4e0 + -(long)local_4a0);
            }
            sourceSize_00 = uVar20 + psVar2->litLength;
            max = 0xff;
            uVar20 = sourceSize_00;
            if (local_440 != 0) {
              if (local_440 == 2) {
                wkspSize = 0x10e4a9;
                sVar9 = HIST_count_wksp(local_4d0,&max,local_4d8,sourceSize_00,local_4d0,0x1800);
                if (sVar9 < 0xffffffffffffff89) {
                  wkspSize = 0x10e4c5;
                  sVar14 = HUF_estimateCompressedSize((HUF_CElt *)local_490,local_4d0,max);
                  sVar9 = local_248;
                  if ((int)local_508 == 0) {
                    sVar9 = 0;
                  }
                  uVar20 = sVar9 + sVar14 + 3;
                }
              }
              else {
                if (local_440 != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x277b,
                                "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                               );
                }
                wkspSize = 1;
                uVar20 = 1;
              }
            }
            pUVar4 = local_4d0;
            puVar13 = (uint *)((long)puVar13 + 1);
            sVar9 = ZSTD_estimateSubBlockSize_symbolType
                              (local_23c,(BYTE *)local_4c0,0x1f,(size_t)puVar13,
                               local_4b0->offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,local_4d0,
                               wkspSize);
            sVar14 = ZSTD_estimateSubBlockSize_symbolType
                               (local_240,(BYTE *)local_4e8,0x23,(size_t)puVar13,local_460,LL_bits,
                                LL_defaultNorm,6,pUVar4,wkspSize);
            local_4f0 = puVar13;
            sVar10 = ZSTD_estimateSubBlockSize_symbolType
                               (local_238,local_4b8,0x34,(size_t)puVar13,local_468,ML_bits,
                                ML_defaultNorm,6,pUVar4,wkspSize);
            psVar15 = local_450;
            puVar13 = local_4f0;
            pbVar21 = (byte *)0x0;
            if ((int)local_508 != 0) {
              pbVar21 = local_40;
            }
          } while ((pbVar21 + uVar20 + sVar10 + sVar9 + sVar14 + 6 <= local_448) &&
                  (uVar20 = sourceSize_00, psVar2 + 1 != local_450));
          local_4fa = psVar2 + 1 == local_450;
          local_4f9 = local_484 != 0;
          wkspSize = 0x10e610;
          dstCapacity_00 = local_4f0;
          local_478 = (byte *)ZSTD_seqDecompressedSize(local_4f8,(size_t)local_4f0,sourceSize_00);
          lVar23 = ((ulong)(0x3ff < sourceSize_00) + 1) - (ulong)(sourceSize_00 < 0x4000);
          bVar24 = (int)local_508 != 0;
        } while ((bVar24) && (uVar20 = 0, sourceSize_00 == 0));
        pbVar21 = local_4e0 + 3;
        pbVar19 = local_4a8 + (-3 - (long)local_4e0);
        if (sourceSize_00 == 0) goto LAB_0010e67c;
        if (local_440 == 1) {
          wkspSize = 0x10e6bb;
          pbVar11 = (byte *)ZSTD_compressRleLiteralsBlock
                                      (pbVar21,(size_t)dstCapacity_00,local_4d8,sourceSize_00);
        }
        else {
          if (local_440 == 0) {
LAB_0010e67c:
            local_4c8 = pbVar21;
            wkspSize = 0x10e68c;
            pbVar11 = (byte *)ZSTD_noCompressLiterals
                                        (local_4c8,(size_t)pbVar19,local_4d8,sourceSize_00);
          }
          else {
            pbVar11 = local_4e0 + lVar23 + 6;
            bVar5 = lVar23 != 0;
            local_4fb = bVar24;
            local_4c8 = pbVar21;
            if ((int)local_508 == 0) {
              local_498 = 0;
            }
            else {
              local_498 = local_248;
              local_4fc = bVar5;
              memcpy(pbVar11,local_43c,local_248);
              pbVar11 = pbVar11 + local_498;
              bVar5 = local_4fc;
            }
            if ((0xff < sourceSize_00 & bVar5) == 0) {
              wkspSize = 0x10e9c5;
              sVar9 = HUF_compress1X_usingCTable
                                (pbVar11,(long)local_4a8 - (long)pbVar11,local_4d8,sourceSize_00,
                                 (HUF_CElt *)local_490);
            }
            else {
              wkspSize = 0x10e9aa;
              sVar9 = HUF_compress4X_usingCTable
                                (pbVar11,(long)local_4a8 - (long)pbVar11,local_4d8,sourceSize_00,
                                 (HUF_CElt *)local_490);
            }
            uVar20 = sourceSize_00;
            if (0xffffffffffffff87 < sVar9 - 1) goto LAB_0010e43c;
            uVar18 = local_498 + sVar9;
            if (((int)local_508 == 0) && (pbVar21 = local_4c8, sourceSize_00 < uVar18))
            goto LAB_0010e67c;
            if (sourceSize_00 < uVar18) goto LAB_0010e43c;
            uVar16 = local_4fb ^ 3;
            uVar12 = (int)sourceSize_00 << 4;
            uVar17 = (uint)uVar18;
            if (lVar23 == 2) {
              *(uint *)(local_4e0 + 3) = uVar17 * 0x400000 + (uVar16 | uVar12) + 0xc;
              local_4e0[7] = (byte)(uVar17 >> 10);
            }
            else if (lVar23 == 1) {
              *(uint *)local_4c8 = uVar17 * 0x40000 + (uVar16 | uVar12) + 8;
            }
            else {
              iVar7 = uVar17 * 0x4000 + (uVar12 | uVar16);
              *(short *)(local_4e0 + 3) = (short)iVar7;
              local_4e0[5] = (byte)((uint)iVar7 >> 0x10);
            }
            pbVar11 = pbVar11 + (sVar9 - (long)local_4c8);
          }
          if ((byte *)0xffffffffffffff88 < pbVar11) {
            return (size_t)pbVar11;
          }
          uVar20 = sourceSize_00;
          pbVar21 = local_4c8;
          if (pbVar11 == (byte *)0x0) goto LAB_0010e43c;
        }
        pbVar19 = local_40;
        pbVar21 = pbVar21 + (long)pbVar11;
        uVar12 = (local_470->appliedParams).cParams.windowLog;
        if ((long)local_4a8 - (long)pbVar21 < 4) {
          return 0xffffffffffffffba;
        }
        if (puVar13 < (uint *)0x7f) {
          *pbVar21 = (byte)puVar13;
          if (puVar13 != (uint *)0x0) {
            pbVar11 = pbVar21 + 1;
            pbVar22 = pbVar21 + 2;
            goto LAB_0010e7c6;
          }
          pbVar22 = (byte *)(ulong)(puVar13 != (uint *)0x0 || (int)local_508 == 0);
LAB_0010e8ca:
          uVar20 = sourceSize_00;
          if (pbVar22 != (byte *)0x0) {
            pbVar19 = pbVar21 + (long)pbVar22 + -(long)local_4e0;
            iVar7 = (local_4f9 & local_4fa | 0xffffffec) + (int)pbVar19 * 8;
            *(short *)local_4e0 = (short)iVar7;
            local_4e0[2] = (byte)((uint)iVar7 >> 0x10);
            if ((byte *)0xffffffffffffff88 < pbVar19) {
              return (size_t)pbVar19;
            }
            if ((pbVar19 != (byte *)0x0) && (pbVar19 < local_478)) {
              bVar24 = local_480 < local_478;
              local_480 = local_480 + -(long)local_478;
              if (bVar24) {
                __assert_fail("remaining >= decompressedSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x280a,
                              "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_entropyCTables_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const int, U32, void *, size_t)"
                             );
              }
              local_4f8 = local_4f8 + (long)puVar13;
              local_4d8 = local_4d8 + sourceSize_00;
              local_4e8 = (ZSTD_fseCTables_t *)((long)local_4e8 + (long)puVar13);
              local_4b8 = local_4b8 + (long)puVar13;
              local_4c0 = (uint *)((long)local_4c0 + (long)puVar13);
              puVar13 = (uint *)0x0;
              local_508 = (ZSTD_compressedBlockState_t *)((ulong)local_508 & 0xffffffff00000000);
              uVar20 = 0;
              local_4e0 = pbVar21 + (long)pbVar22;
            }
          }
        }
        else {
          if (puVar13 < (uint *)0x7f00) {
            bVar5 = (byte)((ulong)puVar13 >> 8) | 0x80;
            pbVar21[1] = (byte)puVar13;
            lVar23 = 2;
          }
          else {
            *(short *)(pbVar21 + 1) = (short)puVar13 + -0x7f00;
            bVar5 = 0xff;
            lVar23 = 3;
          }
          pbVar11 = pbVar21 + lVar23;
          *pbVar21 = bVar5;
          pbVar22 = pbVar21 + lVar23 + 1;
LAB_0010e7c6:
          bVar24 = (int)local_508 == 0;
          local_4c8 = pbVar21;
          if (bVar24) {
            *pbVar11 = 0xfc;
          }
          else {
            *pbVar11 = (char)(local_23c << 4) + (char)(local_240 << 6) + (char)local_238 * '\x04';
            memcpy(pbVar22,local_234,(size_t)local_40);
            pbVar22 = pbVar22 + (long)pbVar19;
          }
          wkspSize = local_458;
          sVar9 = ZSTD_encodeSequences
                            (pbVar22,(long)local_4a8 - (long)pbVar22,local_468,local_4b8,
                             local_4b0->offcodeCTable,(BYTE *)local_4c0,local_460,(BYTE *)local_4e8,
                             local_4f8,(size_t)puVar13,(uint)(0x39 < uVar12),(int)local_458);
          if (0xffffffffffffff88 < sVar9) {
            return sVar9;
          }
          if (((bVar24) || (local_38 == 0)) || (3 < local_38 + sVar9)) {
            uVar20 = sourceSize_00;
            if (3 < (long)(pbVar22 + (sVar9 - (long)pbVar11))) {
              pbVar22 = pbVar22 + (sVar9 - (long)local_4c8);
              pbVar21 = local_4c8;
              if ((byte *)0xffffffffffffff88 < pbVar22) {
                return (size_t)pbVar22;
              }
              goto LAB_0010e8ca;
            }
          }
          else {
            uVar20 = sourceSize_00;
            if (local_38 + sVar9 != 3) {
              __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2726,
                            "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int)"
                           );
            }
          }
        }
        goto LAB_0010e43c;
      }
    }
  }
  return sVar9;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildSuperBlockEntropy(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */));

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            &zc->blockState.nextCBlock->entropy,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}